

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-inl.h
# Opt level: O3

void __thiscall spdlog::spdlog_ex::spdlog_ex(spdlog_ex *this,string *msg,int last_errno)

{
  memory_buf_t outbuf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  buffer<char> local_150;
  char local_130 [256];
  
  *(undefined ***)this = &PTR__spdlog_ex_004dd9c8;
  (this->msg_)._M_dataplus._M_p = (pointer)&(this->msg_).field_2;
  (this->msg_)._M_string_length = 0;
  (this->msg_).field_2._M_local_buf[0] = '\0';
  local_150.size_ = 0;
  local_150.grow_ =
       ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_150.capacity_ = 0xfa;
  local_150.ptr_ = local_130;
  ::fmt::v11::format_system_error(&local_150,last_errno,(msg->_M_dataplus)._M_p);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,local_150.ptr_,local_150.ptr_ + local_150.size_);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->msg_,
             &local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if (local_150.ptr_ != local_130) {
    free(local_150.ptr_);
  }
  return;
}

Assistant:

SPDLOG_INLINE spdlog_ex::spdlog_ex(const std::string &msg, int last_errno) {
#ifdef SPDLOG_USE_STD_FORMAT
    msg_ = std::system_error(std::error_code(last_errno, std::generic_category()), msg).what();
#else
    memory_buf_t outbuf;
    fmt::format_system_error(outbuf, last_errno, msg.c_str());
    msg_ = fmt::to_string(outbuf);
#endif
}